

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Column.cpp
# Opt level: O2

void __thiscall SQLite::Column::Column(Column *this,TStatementPtr *aStmtPtr,int aIndex)

{
  Exception *this_00;
  
  std::__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2> *)this,
             &aStmtPtr->super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>);
  this->mIndex = aIndex;
  if ((aStmtPtr->super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,"Statement was destroyed");
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Column::Column(const Statement::TStatementPtr& aStmtPtr, int aIndex) :
    mStmtPtr(aStmtPtr),
    mIndex(aIndex)
{
    if (!aStmtPtr)
    {
        throw SQLite::Exception("Statement was destroyed");
    }
}